

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O2

bool comparesEqual(QJsonValue *lhs,QJsonValue *rhs)

{
  Type TVar1;
  bool bVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  QArrayDataPointer<char16_t> local_50;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = (lhs->value).t;
  if (TVar1 == (rhs->value).t) {
    if ((uint)(TVar1 + 0xfffffeec) < 4) {
      bVar2 = true;
      goto LAB_002c8f89;
    }
    if (TVar1 == Integer) {
      bVar2 = (lhs->value).n == (rhs->value).n;
      goto LAB_002c8f89;
    }
    if (TVar1 == String) {
      QJsonValue::toString((QString *)&local_38,lhs);
      QJsonValue::toString((QString *)&local_50,rhs);
      bVar2 = comparesEqual((QString *)&local_38,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      goto LAB_002c8f89;
    }
    if (TVar1 == Array) {
      QJsonValue::toArray((QJsonValue *)&local_38);
      QJsonValue::toArray((QJsonValue *)&local_50);
      bVar2 = comparesEqual((QJsonArray *)&local_38,(QJsonArray *)&local_50);
      QJsonArray::~QJsonArray((QJsonArray *)&local_50);
      QJsonArray::~QJsonArray((QJsonArray *)&local_38);
      goto LAB_002c8f89;
    }
    if (TVar1 == Map) {
      QJsonValue::toObject((QJsonValue *)&local_38);
      QJsonValue::toObject((QJsonValue *)&local_50);
      bVar2 = comparesEqual((QJsonObject *)&local_38,(QJsonObject *)&local_50);
      QJsonObject::~QJsonObject((QJsonObject *)&local_50);
      QJsonObject::~QJsonObject((QJsonObject *)&local_38);
      goto LAB_002c8f89;
    }
    if (TVar1 == Double) {
      bVar2 = (double)(rhs->value).n == (double)(lhs->value).n;
      goto LAB_002c8f81;
    }
  }
  else {
    bVar2 = QJsonValue::isDouble(lhs);
    if (bVar2) {
      bVar2 = QJsonValue::isDouble(rhs);
      if (bVar2) {
        TVar1 = (lhs->value).t;
        if (TVar1 == Integer) {
          dVar3 = (double)(lhs->value).n;
        }
        else {
          dVar3 = 0.0;
          if (TVar1 == Double) {
            dVar3 = (double)(lhs->value).n;
          }
        }
        TVar1 = (rhs->value).t;
        if (TVar1 == Integer) {
          dVar4 = (double)(rhs->value).n;
        }
        else {
          dVar4 = 0.0;
          if (TVar1 == Double) {
            dVar4 = (double)(rhs->value).n;
          }
        }
        bVar2 = dVar3 == dVar4;
LAB_002c8f81:
        bVar2 = (bool)(-bVar2 & 1);
        goto LAB_002c8f89;
      }
    }
  }
  bVar2 = false;
LAB_002c8f89:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool comparesEqual(const QJsonValue &lhs, const QJsonValue &rhs)
{
    if (lhs.value.type() != rhs.value.type()) {
        if (lhs.isDouble() && rhs.isDouble()) {
            // One value Cbor integer, one Cbor double, should interact as doubles.
            return lhs.toDouble() == rhs.toDouble();
        }
        return false;
    }

    switch (lhs.value.type()) {
    case QCborValue::Undefined:
    case QCborValue::Null:
    case QCborValue::True:
    case QCborValue::False:
        break;
    case QCborValue::Double:
        return lhs.toDouble() == rhs.toDouble();
    case QCborValue::Integer:
        return QJsonPrivate::Value::valueHelper(lhs.value)
                == QJsonPrivate::Value::valueHelper(rhs.value);
    case QCborValue::String:
        return lhs.toString() == rhs.toString();
    case QCborValue::Array:
        return lhs.toArray() == rhs.toArray();
    case QCborValue::Map:
        return lhs.toObject() == rhs.toObject();
    default:
        return false;
    }
    return true;
}